

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O3

void __thiscall minihttp::DLSocket::_OnRecv(DLSocket *this,void *incoming,uint size)

{
  ulong uVar1;
  char *pcVar2;
  size_t __size;
  ulong __n;
  
  if ((size != 0) && ((this->super_HttpSocket)._status - 200 < 6)) {
    __n = (ulong)size;
    uVar1 = this->bufcap;
    if (uVar1 <= this->bufsz + __n + 1) {
      __size = (uVar1 >> 1) + __n + 1 + uVar1;
      this->bufcap = __size;
      pcVar2 = (char *)realloc(this->buf,__size);
      this->buf = pcVar2;
      if (pcVar2 == (char *)0x0) {
        this->fail = true;
        TcpSocket::close((TcpSocket *)this,(int)__size);
      }
    }
    memcpy(this->buf + this->bufsz,incoming,__n);
    this->bufsz = this->bufsz + __n;
  }
  return;
}

Assistant:

void _OnRecv(void *incoming, unsigned size)
    {
        if(!size || !IsSuccess())
            return;
        if(bufsz + size + 1 >= bufcap) // always make sure there's 1 more byte free for the zero-terminator
        {
            bufcap += (bufcap / 2) + size + 1;
            buf = (char*)realloc(buf, bufcap);
            if(!buf)
            {
                fail = true;
                close();
            }
        }
        memcpy(buf + bufsz, incoming, size);
        bufsz += size;
    }